

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack4.h
# Opt level: O1

void ncnn::convolution_winograd_dot_pack4_sse
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _w;
  uint _c;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  float *pfVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  uint uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  void *pvVar29;
  int iVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  float *pfVar33;
  ulong uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  ulong local_a8;
  Mat local_98;
  Mat *local_48;
  Mat *local_40;
  ulong local_38;
  
  _w = bottom_blob_tm->w;
  uVar34 = (ulong)(int)_w;
  _c = bottom_blob_tm->h;
  iVar5 = bottom_blob_tm->c;
  local_98.cstep = 0;
  local_98.data = (Allocator *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elempack = 0;
  local_98._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)uVar34 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        iVar30 = iVar5;
        uVar25 = _w;
        if (1 < (int)_w) {
          iVar30 = iVar5 * 2;
          uVar25 = (_w & 1) + 1;
        }
      }
      else {
        iVar30 = iVar5 * 4;
        uVar25 = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
      }
    }
    else {
      iVar30 = iVar5 * 8;
      uVar25 = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
    }
  }
  else {
    uVar25 = _w % 0xc;
    iVar30 = iVar5 * 0xc;
    uVar25 = (uVar25 & 1) + (uVar25 >> 3) + _w / 0xc + (uVar25 >> 2 & 1) +
             (uint)((uVar25 >> 1 & 1) != 0);
  }
  local_98.elemsize._4_4_ = (int)local_98.refcount;
  local_98.allocator = (Allocator *)local_98.data;
  local_98.dims = (int)local_98.refcount;
  local_98.w = local_98.refcount._4_4_;
  local_98.c = local_98.elempack;
  local_48 = top_blob_tm;
  local_40 = kernel_tm;
  Mat::create(&local_98,iVar30,uVar25,_c,0x10,4,opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar26 = 0;
    do {
      lVar21 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      lVar28 = local_98.cstep * uVar26 * lVar21;
      lVar17 = (long)local_98.w;
      uVar31 = 0;
      if (0xb < (int)_w) {
        uVar31 = 0;
        do {
          iVar30 = (int)uVar31;
          if (0 < iVar5) {
            pauVar32 = (undefined1 (*) [16])
                       ((ulong)((_w * (int)uVar26 + iVar30) * 4) * 4 + (long)bottom_blob_tm->data);
            pauVar24 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_98.data +
                       (uVar31 / 0xc) * lVar21 * lVar17 + lVar28);
            iVar15 = iVar5;
            do {
              auVar44 = vunpcklps_avx(*pauVar32,pauVar32[1]);
              auVar55 = vunpcklps_avx(pauVar32[2],pauVar32[3]);
              auVar48 = vunpckhps_avx(*pauVar32,pauVar32[1]);
              auVar52 = vunpckhps_avx(pauVar32[2],pauVar32[3]);
              auVar39 = vmovlhps_avx(auVar44,auVar55);
              auVar61 = vunpckhpd_avx(auVar44,auVar55);
              auVar44 = vmovlhps_avx(auVar48,auVar52);
              auVar64 = vunpckhpd_avx(auVar48,auVar52);
              auVar52 = vunpcklps_avx(pauVar32[4],pauVar32[5]);
              auVar66 = vunpcklps_avx(pauVar32[6],pauVar32[7]);
              auVar55 = vunpckhps_avx(pauVar32[4],pauVar32[5]);
              auVar58 = vunpckhps_avx(pauVar32[6],pauVar32[7]);
              auVar48 = vmovlhps_avx(auVar52,auVar66);
              auVar66 = vunpckhpd_avx(auVar52,auVar66);
              auVar52 = vmovlhps_avx(auVar55,auVar58);
              auVar68 = vunpckhpd_avx(auVar55,auVar58);
              auVar58 = vunpcklps_avx(pauVar32[8],pauVar32[9]);
              auVar70 = vunpcklps_avx(pauVar32[10],pauVar32[0xb]);
              auVar40 = vunpckhps_avx(pauVar32[8],pauVar32[9]);
              auVar45 = vunpckhps_avx(pauVar32[10],pauVar32[0xb]);
              auVar55 = vmovlhps_avx(auVar58,auVar70);
              auVar70 = vunpckhpd_avx(auVar58,auVar70);
              auVar58 = vmovlhps_avx(auVar40,auVar45);
              auVar40 = vunpckhpd_avx(auVar40,auVar45);
              *pauVar24 = auVar39;
              pauVar24[1] = auVar48;
              pauVar24[2] = auVar55;
              pauVar24[3] = auVar61;
              pauVar24[4] = auVar66;
              pauVar24[5] = auVar70;
              pauVar24[6] = auVar44;
              pauVar24[7] = auVar52;
              pauVar24[8] = auVar58;
              pauVar24[9] = auVar64;
              pauVar24[10] = auVar68;
              pauVar24[0xb] = auVar40;
              pauVar32 = pauVar32 + bottom_blob_tm->cstep;
              pauVar24 = pauVar24 + 0xc;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          uVar31 = uVar31 + 0xc;
        } while (iVar30 + 0x17 < (int)_w);
      }
      if ((int)uVar31 + 7 < (int)_w) {
        uVar20 = (long)(int)uVar31;
        do {
          if (0 < iVar5) {
            pauVar24 = (undefined1 (*) [16])
                       ((uVar20 + uVar26 * uVar34) * 0x10 + (long)bottom_blob_tm->data);
            pauVar32 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)(((uint)((int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc) >> 3
                               ) + (int)((uVar20 & 0xffffffff) / 0xc)) * lVar21 * lVar17 + lVar28);
            iVar30 = iVar5;
            do {
              auVar44 = vunpcklps_avx(*pauVar24,pauVar24[1]);
              auVar55 = vunpcklps_avx(pauVar24[2],pauVar24[3]);
              auVar48 = vunpckhps_avx(*pauVar24,pauVar24[1]);
              auVar52 = vunpckhps_avx(pauVar24[2],pauVar24[3]);
              auVar39 = vmovlhps_avx(auVar44,auVar55);
              auVar55 = vunpckhpd_avx(auVar44,auVar55);
              auVar44 = vmovlhps_avx(auVar48,auVar52);
              auVar58 = vunpckhpd_avx(auVar48,auVar52);
              auVar52 = vunpcklps_avx(pauVar24[4],pauVar24[5]);
              auVar61 = vunpcklps_avx(pauVar24[6],pauVar24[7]);
              auVar64 = vunpckhps_avx(pauVar24[4],pauVar24[5]);
              auVar66 = vunpckhps_avx(pauVar24[6],pauVar24[7]);
              auVar48 = vmovlhps_avx(auVar52,auVar61);
              auVar61 = vunpckhpd_avx(auVar52,auVar61);
              auVar52 = vmovlhps_avx(auVar64,auVar66);
              auVar64 = vunpckhpd_avx(auVar64,auVar66);
              *pauVar32 = auVar39;
              pauVar32[1] = auVar48;
              pauVar32[2] = auVar55;
              pauVar32[3] = auVar61;
              pauVar32[4] = auVar44;
              pauVar32[5] = auVar52;
              pauVar32[6] = auVar58;
              pauVar32[7] = auVar64;
              pauVar24 = pauVar24 + bottom_blob_tm->cstep;
              pauVar32 = pauVar32 + 8;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar31 = uVar20 + 8;
          bVar10 = (long)uVar20 < (long)(uVar34 - 0xf);
          uVar20 = uVar31;
        } while (bVar10);
      }
      if ((int)((uint)uVar31 | 3) < (int)_w) {
        uVar20 = (long)(int)(uint)uVar31;
        do {
          if (0 < iVar5) {
            pauVar24 = (undefined1 (*) [16])
                       ((uVar20 + uVar26 * uVar34) * 0x10 + (long)bottom_blob_tm->data);
            uVar25 = (int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc;
            pauVar32 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar25 >> 3) + (int)((uVar20 & 0xffffffff) / 0xc) +
                              (uint)((uVar25 >> 2 & 1) != 0)) * lVar21 * lVar17 + lVar28);
            iVar30 = iVar5;
            do {
              auVar44 = vunpcklps_avx(*pauVar24,pauVar24[1]);
              auVar48 = vunpcklps_avx(pauVar24[2],pauVar24[3]);
              auVar52 = vunpckhps_avx(*pauVar24,pauVar24[1]);
              auVar55 = vunpckhps_avx(pauVar24[2],pauVar24[3]);
              auVar39 = vmovlhps_avx(auVar44,auVar48);
              auVar48 = vunpckhpd_avx(auVar44,auVar48);
              auVar44 = vmovlhps_avx(auVar52,auVar55);
              auVar52 = vunpckhpd_avx(auVar52,auVar55);
              *pauVar32 = auVar39;
              pauVar32[1] = auVar48;
              pauVar32[2] = auVar44;
              pauVar32[3] = auVar52;
              pauVar24 = pauVar24 + bottom_blob_tm->cstep;
              pauVar32 = pauVar32 + 4;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar31 = uVar20 + 4;
          lVar19 = uVar20 + 7;
          uVar20 = uVar31;
        } while (lVar19 < (long)uVar34);
      }
      if ((int)((uint)uVar31 | 1) < (int)_w) {
        uVar20 = (long)(int)(uint)uVar31;
        do {
          if (0 < iVar5) {
            pauVar24 = (undefined1 (*) [16])
                       ((uVar20 + uVar26 * uVar34) * 0x10 + (long)bottom_blob_tm->data);
            uVar25 = (int)uVar20 + (int)((uVar20 & 0xffffffff) / 0xc) * -0xc;
            pauVar32 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar25 >> 2 & 1) +
                               (uVar25 >> 3) + (int)((uVar20 & 0xffffffff) / 0xc) +
                              (uint)((uVar25 >> 1 & 1) != 0)) * lVar21 * lVar17 + lVar28);
            iVar30 = iVar5;
            do {
              auVar44 = vunpcklps_avx(*pauVar24,pauVar24[1]);
              auVar39 = vunpckhps_avx(*pauVar24,pauVar24[1]);
              *pauVar32 = auVar44;
              pauVar32[1] = auVar39;
              pauVar24 = pauVar24 + bottom_blob_tm->cstep;
              pauVar32 = pauVar32 + 2;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar31 = uVar20 + 2;
          lVar19 = uVar20 + 3;
          uVar20 = uVar31;
        } while (lVar19 < (long)uVar34);
      }
      if ((int)uVar31 < (int)_w) {
        uVar31 = (ulong)(int)uVar31;
        do {
          if (0 < iVar5) {
            pauVar24 = (undefined1 (*) [16])
                       ((uVar31 + uVar26 * uVar34) * 0x10 + (long)bottom_blob_tm->data);
            uVar25 = (int)uVar31 + (int)((uVar31 & 0xffffffff) / 0xc) * -0xc;
            pauVar32 = (undefined1 (*) [16])
                       ((long)(_func_int ***)local_98.data +
                       (ulong)((uVar25 >> 2 & 1) +
                               (uVar25 & 1) + (uVar25 >> 3) + (int)((uVar31 & 0xffffffff) / 0xc) +
                              (uint)((uVar25 >> 1 & 1) != 0)) * lVar21 * lVar17 + lVar28);
            iVar30 = iVar5;
            do {
              *pauVar32 = *pauVar24;
              pauVar24 = pauVar24 + bottom_blob_tm->cstep;
              pauVar32 = pauVar32 + 1;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != uVar34);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != _c);
  }
  piVar6 = bottom_blob_tm->refcount;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        if (bottom_blob_tm->data != (void *)0x0) {
          free(bottom_blob_tm->data);
        }
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  *(undefined4 *)&bottom_blob_tm->data = 0;
  *(undefined4 *)((long)&bottom_blob_tm->data + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->refcount = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->elemsize = 0;
  *(undefined4 *)((long)&bottom_blob_tm->elemsize + 4) = 0;
  bottom_blob_tm->elempack = 0;
  *(undefined4 *)&bottom_blob_tm->allocator = 0;
  *(undefined4 *)((long)&bottom_blob_tm->allocator + 4) = 0;
  bottom_blob_tm->dims = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->h = 0;
  bottom_blob_tm->d = 0;
  bottom_blob_tm->c = 0;
  Mat::create(local_48,_w,_c,outch,0x10,4,opt->workspace_allocator);
  if (0 < outch) {
    iVar30 = 1;
    if (1 < iVar5 * 4) {
      iVar30 = iVar5 * 4;
    }
    local_38 = (ulong)(uint)outch;
    local_a8 = 0;
    do {
      if (0 < (int)_c) {
        sVar7 = local_40->cstep;
        pvVar8 = local_40->data;
        sVar9 = local_40->elemsize;
        lVar21 = (long)local_40->w * sVar9;
        pauVar24 = (undefined1 (*) [16])
                   (local_48->cstep * local_a8 * local_48->elemsize + (long)local_48->data);
        pvVar29 = (void *)(sVar7 * sVar9 * local_a8 + (long)pvVar8);
        uVar34 = 0;
        do {
          lVar28 = local_98.cstep * uVar34;
          lVar17 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
          uVar26 = 0;
          lVar19 = (long)local_98.w;
          if (0xb < (int)_w) {
            uVar31 = 0;
            do {
              if (iVar5 < 1) {
                auVar39 = SUB6416(ZEXT864(0),0);
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                fVar38 = 0.0;
                auVar44 = SUB6416(ZEXT864(0),0);
                auVar48 = SUB6416(ZEXT864(0),0);
                auVar52 = SUB6416(ZEXT864(0),0);
                auVar55 = SUB6416(ZEXT864(0),0);
                auVar58 = SUB6416(ZEXT864(0),0);
                auVar64 = SUB6416(ZEXT864(0),0);
                auVar66 = SUB6416(ZEXT864(0),0);
                auVar68 = SUB6416(ZEXT864(0),0);
                auVar70 = SUB6416(ZEXT864(0),0);
                auVar61 = SUB6416(ZEXT864(0),0);
              }
              else {
                pfVar22 = (float *)((long)(_func_int ***)local_98.data +
                                   (uVar31 / 0xc) * lVar17 * lVar19 + lVar28 * lVar17);
                auVar63 = ZEXT864(0);
                auVar71 = ZEXT864(0);
                auVar69 = ZEXT864(0);
                auVar67 = ZEXT864(0);
                auVar65 = ZEXT864(0);
                auVar60 = ZEXT864(0);
                auVar57 = ZEXT864(0);
                auVar54 = ZEXT864(0);
                auVar51 = ZEXT864(0);
                auVar47 = ZEXT864(0);
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                fVar38 = 0.0;
                auVar43 = ZEXT864(0);
                pfVar33 = (float *)((long)pvVar8 + lVar21 * uVar34 + sVar7 * local_a8 * sVar9);
                iVar15 = iVar30;
                do {
                  fVar2 = *pfVar33;
                  fVar3 = pfVar33[1];
                  fVar4 = pfVar33[2];
                  fVar11 = pfVar33[3];
                  fVar1 = *pfVar22;
                  auVar61._0_4_ = fVar1 * fVar2 + auVar63._0_4_;
                  auVar61._4_4_ = fVar1 * fVar3 + auVar63._4_4_;
                  auVar61._8_4_ = fVar1 * fVar4 + auVar63._8_4_;
                  auVar61._12_4_ = fVar1 * fVar11 + auVar63._12_4_;
                  auVar63 = ZEXT1664(auVar61);
                  fVar1 = pfVar22[1];
                  auVar70._0_4_ = fVar1 * fVar2 + auVar71._0_4_;
                  auVar70._4_4_ = fVar1 * fVar3 + auVar71._4_4_;
                  auVar70._8_4_ = fVar1 * fVar4 + auVar71._8_4_;
                  auVar70._12_4_ = fVar1 * fVar11 + auVar71._12_4_;
                  auVar71 = ZEXT1664(auVar70);
                  fVar1 = pfVar22[2];
                  auVar68._0_4_ = fVar1 * fVar2 + auVar69._0_4_;
                  auVar68._4_4_ = fVar1 * fVar3 + auVar69._4_4_;
                  auVar68._8_4_ = fVar1 * fVar4 + auVar69._8_4_;
                  auVar68._12_4_ = fVar1 * fVar11 + auVar69._12_4_;
                  auVar69 = ZEXT1664(auVar68);
                  fVar1 = pfVar22[3];
                  auVar66._0_4_ = fVar1 * fVar2 + auVar67._0_4_;
                  auVar66._4_4_ = fVar1 * fVar3 + auVar67._4_4_;
                  auVar66._8_4_ = fVar1 * fVar4 + auVar67._8_4_;
                  auVar66._12_4_ = fVar1 * fVar11 + auVar67._12_4_;
                  auVar67 = ZEXT1664(auVar66);
                  fVar1 = pfVar22[4];
                  auVar64._0_4_ = fVar1 * fVar2 + auVar65._0_4_;
                  auVar64._4_4_ = fVar1 * fVar3 + auVar65._4_4_;
                  auVar64._8_4_ = fVar1 * fVar4 + auVar65._8_4_;
                  auVar64._12_4_ = fVar1 * fVar11 + auVar65._12_4_;
                  auVar65 = ZEXT1664(auVar64);
                  fVar1 = pfVar22[5];
                  auVar58._0_4_ = fVar1 * fVar2 + auVar60._0_4_;
                  auVar58._4_4_ = fVar1 * fVar3 + auVar60._4_4_;
                  auVar58._8_4_ = fVar1 * fVar4 + auVar60._8_4_;
                  auVar58._12_4_ = fVar1 * fVar11 + auVar60._12_4_;
                  auVar60 = ZEXT1664(auVar58);
                  fVar1 = pfVar22[6];
                  auVar55._0_4_ = fVar1 * fVar2 + auVar57._0_4_;
                  auVar55._4_4_ = fVar1 * fVar3 + auVar57._4_4_;
                  auVar55._8_4_ = fVar1 * fVar4 + auVar57._8_4_;
                  auVar55._12_4_ = fVar1 * fVar11 + auVar57._12_4_;
                  auVar57 = ZEXT1664(auVar55);
                  fVar1 = pfVar22[7];
                  auVar52._0_4_ = fVar1 * fVar2 + auVar54._0_4_;
                  auVar52._4_4_ = fVar1 * fVar3 + auVar54._4_4_;
                  auVar52._8_4_ = fVar1 * fVar4 + auVar54._8_4_;
                  auVar52._12_4_ = fVar1 * fVar11 + auVar54._12_4_;
                  auVar54 = ZEXT1664(auVar52);
                  fVar1 = pfVar22[8];
                  auVar48._0_4_ = fVar1 * fVar2 + auVar51._0_4_;
                  auVar48._4_4_ = fVar1 * fVar3 + auVar51._4_4_;
                  auVar48._8_4_ = fVar1 * fVar4 + auVar51._8_4_;
                  auVar48._12_4_ = fVar1 * fVar11 + auVar51._12_4_;
                  auVar51 = ZEXT1664(auVar48);
                  fVar1 = pfVar22[9];
                  auVar44._0_4_ = fVar1 * fVar2 + auVar47._0_4_;
                  auVar44._4_4_ = fVar1 * fVar3 + auVar47._4_4_;
                  auVar44._8_4_ = fVar1 * fVar4 + auVar47._8_4_;
                  auVar44._12_4_ = fVar1 * fVar11 + auVar47._12_4_;
                  auVar47 = ZEXT1664(auVar44);
                  fVar1 = pfVar22[10];
                  auVar39._0_4_ = fVar1 * fVar2 + auVar43._0_4_;
                  auVar39._4_4_ = fVar1 * fVar3 + auVar43._4_4_;
                  auVar39._8_4_ = fVar1 * fVar4 + auVar43._8_4_;
                  auVar39._12_4_ = fVar1 * fVar11 + auVar43._12_4_;
                  auVar43 = ZEXT1664(auVar39);
                  fVar1 = pfVar22[0xb];
                  fVar35 = fVar1 * fVar2 + fVar35;
                  fVar36 = fVar1 * fVar3 + fVar36;
                  fVar37 = fVar1 * fVar4 + fVar37;
                  fVar38 = fVar1 * fVar11 + fVar38;
                  pfVar22 = pfVar22 + 0xc;
                  pfVar33 = pfVar33 + 4;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *pauVar24 = auVar61;
              pauVar24[1] = auVar70;
              pauVar24[2] = auVar68;
              pauVar24[3] = auVar66;
              pauVar24[4] = auVar64;
              pauVar24[5] = auVar58;
              pauVar24[6] = auVar55;
              pauVar24[7] = auVar52;
              pauVar24[8] = auVar48;
              pauVar24[9] = auVar44;
              pauVar24[10] = auVar39;
              *(float *)pauVar24[0xb] = fVar35;
              *(float *)(pauVar24[0xb] + 4) = fVar36;
              *(float *)(pauVar24[0xb] + 8) = fVar37;
              *(float *)(pauVar24[0xb] + 0xc) = fVar38;
              pauVar24 = pauVar24 + 0xc;
              uVar26 = uVar31 + 0xc;
              iVar15 = (int)uVar31;
              uVar31 = uVar26;
            } while (iVar15 + 0x17 < (int)_w);
          }
          uVar25 = (uint)uVar26;
          for (iVar15 = uVar25 + 7; iVar15 < (int)_w; iVar15 = iVar15 + 0xf) {
            iVar15 = (int)uVar26;
            if (iVar5 < 1) {
              auVar62 = SUB6416(ZEXT864(0),0);
              auVar59 = SUB6416(ZEXT864(0),0);
              auVar56 = SUB6416(ZEXT864(0),0);
              auVar53 = SUB6416(ZEXT864(0),0);
              auVar49 = SUB6416(ZEXT864(0),0);
              auVar45 = SUB6416(ZEXT864(0),0);
              auVar40 = SUB6416(ZEXT864(0),0);
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
            }
            else {
              lVar18 = ((ulong)(((uint)(iVar15 + (int)((uVar26 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                               (int)((uVar26 & 0xffffffff) / 0xc)) * lVar19 + lVar28) * lVar17;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              lVar23 = 0;
              auVar43 = ZEXT864(0);
              auVar47 = ZEXT864(0);
              auVar51 = ZEXT864(0);
              auVar54 = ZEXT864(0);
              auVar57 = ZEXT864(0);
              auVar60 = ZEXT864(0);
              auVar63 = ZEXT864(0);
              iVar27 = iVar30;
              do {
                pfVar33 = (float *)((long)pvVar29 + lVar23);
                fVar2 = *pfVar33;
                fVar3 = pfVar33[1];
                fVar4 = pfVar33[2];
                fVar11 = pfVar33[3];
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar23 * 2 + lVar18);
                auVar62._0_4_ = fVar1 * fVar2 + auVar63._0_4_;
                auVar62._4_4_ = fVar1 * fVar3 + auVar63._4_4_;
                auVar62._8_4_ = fVar1 * fVar4 + auVar63._8_4_;
                auVar62._12_4_ = fVar1 * fVar11 + auVar63._12_4_;
                auVar63 = ZEXT1664(auVar62);
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar23 * 2 + lVar18 + 4);
                auVar59._0_4_ = fVar1 * fVar2 + auVar60._0_4_;
                auVar59._4_4_ = fVar1 * fVar3 + auVar60._4_4_;
                auVar59._8_4_ = fVar1 * fVar4 + auVar60._8_4_;
                auVar59._12_4_ = fVar1 * fVar11 + auVar60._12_4_;
                auVar60 = ZEXT1664(auVar59);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar23 * 2 + lVar18);
                auVar56._0_4_ = fVar1 * fVar2 + auVar57._0_4_;
                auVar56._4_4_ = fVar1 * fVar3 + auVar57._4_4_;
                auVar56._8_4_ = fVar1 * fVar4 + auVar57._8_4_;
                auVar56._12_4_ = fVar1 * fVar11 + auVar57._12_4_;
                auVar57 = ZEXT1664(auVar56);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar23 * 2 + lVar18 + 4);
                auVar53._0_4_ = fVar1 * fVar2 + auVar54._0_4_;
                auVar53._4_4_ = fVar1 * fVar3 + auVar54._4_4_;
                auVar53._8_4_ = fVar1 * fVar4 + auVar54._8_4_;
                auVar53._12_4_ = fVar1 * fVar11 + auVar54._12_4_;
                auVar54 = ZEXT1664(auVar53);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x10))->
                                          _vptr_Allocator + lVar23 * 2 + lVar18);
                auVar49._0_4_ = fVar1 * fVar2 + auVar51._0_4_;
                auVar49._4_4_ = fVar1 * fVar3 + auVar51._4_4_;
                auVar49._8_4_ = fVar1 * fVar4 + auVar51._8_4_;
                auVar49._12_4_ = fVar1 * fVar11 + auVar51._12_4_;
                auVar51 = ZEXT1664(auVar49);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x10))->
                                          _vptr_Allocator + lVar23 * 2 + lVar18 + 4);
                auVar45._0_4_ = fVar1 * fVar2 + auVar47._0_4_;
                auVar45._4_4_ = fVar1 * fVar3 + auVar47._4_4_;
                auVar45._8_4_ = fVar1 * fVar4 + auVar47._8_4_;
                auVar45._12_4_ = fVar1 * fVar11 + auVar47._12_4_;
                auVar47 = ZEXT1664(auVar45);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x18))->
                                          _vptr_Allocator + lVar23 * 2 + lVar18);
                auVar40._0_4_ = fVar1 * fVar2 + auVar43._0_4_;
                auVar40._4_4_ = fVar1 * fVar3 + auVar43._4_4_;
                auVar40._8_4_ = fVar1 * fVar4 + auVar43._8_4_;
                auVar40._12_4_ = fVar1 * fVar11 + auVar43._12_4_;
                auVar43 = ZEXT1664(auVar40);
                fVar1 = *(float *)((long)&((Allocator *)((long)local_98.data + 0x18))->
                                          _vptr_Allocator + lVar23 * 2 + lVar18 + 4);
                fVar35 = fVar1 * fVar2 + fVar35;
                fVar36 = fVar1 * fVar3 + fVar36;
                fVar37 = fVar1 * fVar4 + fVar37;
                fVar38 = fVar1 * fVar11 + fVar38;
                lVar23 = lVar23 + 0x10;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            *pauVar24 = auVar62;
            pauVar24[1] = auVar59;
            pauVar24[2] = auVar56;
            pauVar24[3] = auVar53;
            pauVar24[4] = auVar49;
            pauVar24[5] = auVar45;
            pauVar24[6] = auVar40;
            *(float *)pauVar24[7] = fVar35;
            *(float *)(pauVar24[7] + 4) = fVar36;
            *(float *)(pauVar24[7] + 8) = fVar37;
            *(float *)(pauVar24[7] + 0xc) = fVar38;
            pauVar24 = pauVar24 + 8;
            uVar25 = iVar15 + 8;
            uVar26 = (ulong)uVar25;
          }
          uVar16 = uVar25 | 3;
          while ((int)uVar16 < (int)_w) {
            if (iVar5 < 1) {
              auVar50 = SUB6416(ZEXT864(0),0);
              auVar46 = SUB6416(ZEXT864(0),0);
              auVar41 = SUB6416(ZEXT864(0),0);
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
            }
            else {
              lVar18 = ((ulong)((uVar25 % 0xc >> 3) + uVar25 / 0xc +
                               (uint)((uVar25 % 0xc >> 2 & 1) != 0)) * lVar19 + lVar28) * lVar17;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              lVar23 = 0;
              auVar43 = ZEXT864(0);
              auVar47 = ZEXT864(0);
              auVar51 = ZEXT864(0);
              iVar15 = iVar30;
              do {
                pfVar33 = (float *)((long)pvVar29 + lVar23);
                fVar11 = *pfVar33;
                fVar12 = pfVar33[1];
                fVar13 = pfVar33[2];
                fVar14 = pfVar33[3];
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar23 + lVar18);
                fVar2 = *(float *)((long)(_func_int ***)local_98.data + lVar23 + lVar18 + 4);
                fVar3 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar23 + lVar18);
                fVar4 = *(float *)((long)&((Allocator *)((long)local_98.data + 8))->_vptr_Allocator
                                  + lVar23 + lVar18 + 4);
                auVar50._0_4_ = fVar1 * fVar11 + auVar51._0_4_;
                auVar50._4_4_ = fVar1 * fVar12 + auVar51._4_4_;
                auVar50._8_4_ = fVar1 * fVar13 + auVar51._8_4_;
                auVar50._12_4_ = fVar1 * fVar14 + auVar51._12_4_;
                auVar51 = ZEXT1664(auVar50);
                auVar46._0_4_ = fVar2 * fVar11 + auVar47._0_4_;
                auVar46._4_4_ = fVar2 * fVar12 + auVar47._4_4_;
                auVar46._8_4_ = fVar2 * fVar13 + auVar47._8_4_;
                auVar46._12_4_ = fVar2 * fVar14 + auVar47._12_4_;
                auVar47 = ZEXT1664(auVar46);
                auVar41._0_4_ = fVar3 * fVar11 + auVar43._0_4_;
                auVar41._4_4_ = fVar3 * fVar12 + auVar43._4_4_;
                auVar41._8_4_ = fVar3 * fVar13 + auVar43._8_4_;
                auVar41._12_4_ = fVar3 * fVar14 + auVar43._12_4_;
                auVar43 = ZEXT1664(auVar41);
                fVar35 = fVar4 * fVar11 + fVar35;
                fVar36 = fVar4 * fVar12 + fVar36;
                fVar37 = fVar4 * fVar13 + fVar37;
                fVar38 = fVar4 * fVar14 + fVar38;
                lVar23 = lVar23 + 0x10;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            *pauVar24 = auVar50;
            pauVar24[1] = auVar46;
            pauVar24[2] = auVar41;
            *(float *)pauVar24[3] = fVar35;
            *(float *)(pauVar24[3] + 4) = fVar36;
            *(float *)(pauVar24[3] + 8) = fVar37;
            *(float *)(pauVar24[3] + 0xc) = fVar38;
            pauVar24 = pauVar24 + 4;
            uVar16 = uVar25 + 7;
            uVar25 = uVar25 + 4;
          }
          uVar16 = uVar25 | 1;
          while ((int)uVar16 < (int)_w) {
            uVar16 = uVar25 % 0xc;
            if (iVar5 < 1) {
              auVar42 = SUB6416(ZEXT864(0),0);
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
            }
            else {
              lVar18 = ((ulong)((uVar16 >> 2 & 1) + (uVar16 >> 3) + uVar25 / 0xc +
                               (uint)((uVar16 >> 1 & 1) != 0)) * lVar19 + lVar28) * lVar17;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              lVar23 = 0;
              auVar43 = ZEXT864(0);
              iVar15 = iVar30;
              do {
                pfVar33 = (float *)((long)pvVar29 + lVar23 * 2);
                fVar1 = *(float *)((long)(_func_int ***)local_98.data + lVar23 + lVar18);
                fVar2 = *(float *)((long)(_func_int ***)local_98.data + lVar23 + lVar18 + 4);
                auVar42._0_4_ = fVar1 * *pfVar33 + auVar43._0_4_;
                auVar42._4_4_ = fVar1 * pfVar33[1] + auVar43._4_4_;
                auVar42._8_4_ = fVar1 * pfVar33[2] + auVar43._8_4_;
                auVar42._12_4_ = fVar1 * pfVar33[3] + auVar43._12_4_;
                auVar43 = ZEXT1664(auVar42);
                fVar35 = fVar2 * *pfVar33 + fVar35;
                fVar36 = fVar2 * pfVar33[1] + fVar36;
                fVar37 = fVar2 * pfVar33[2] + fVar37;
                fVar38 = fVar2 * pfVar33[3] + fVar38;
                lVar23 = lVar23 + 8;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            *pauVar24 = auVar42;
            *(float *)pauVar24[1] = fVar35;
            *(float *)(pauVar24[1] + 4) = fVar36;
            *(float *)(pauVar24[1] + 8) = fVar37;
            *(float *)(pauVar24[1] + 0xc) = fVar38;
            pauVar24 = pauVar24 + 2;
            uVar16 = uVar25 + 3;
            uVar25 = uVar25 + 2;
          }
          if ((int)uVar25 < (int)_w) {
            do {
              uVar16 = uVar25 % 0xc;
              if (iVar5 < 1) {
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                fVar38 = 0.0;
              }
              else {
                fVar35 = 0.0;
                fVar36 = 0.0;
                fVar37 = 0.0;
                fVar38 = 0.0;
                lVar18 = 0;
                iVar15 = iVar30;
                do {
                  fVar1 = *(float *)((long)(_func_int ***)local_98.data +
                                    lVar18 + ((ulong)((uVar16 >> 2 & 1) +
                                                      (uVar25 & 1) + uVar25 / 0xc + (uVar16 >> 3) +
                                                     (uint)((uVar16 >> 1 & 1) != 0)) * lVar19 +
                                             lVar28) * lVar17);
                  pfVar33 = (float *)((long)pvVar29 + lVar18 * 4);
                  fVar35 = fVar1 * *pfVar33 + fVar35;
                  fVar36 = fVar1 * pfVar33[1] + fVar36;
                  fVar37 = fVar1 * pfVar33[2] + fVar37;
                  fVar38 = fVar1 * pfVar33[3] + fVar38;
                  lVar18 = lVar18 + 4;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *(float *)*pauVar24 = fVar35;
              *(float *)(*pauVar24 + 4) = fVar36;
              *(float *)(*pauVar24 + 8) = fVar37;
              *(float *)(*pauVar24 + 0xc) = fVar38;
              pauVar24 = pauVar24 + 1;
              uVar25 = uVar25 + 1;
            } while (uVar25 != _w);
          }
          uVar34 = uVar34 + 1;
          pvVar29 = (void *)((long)pvVar29 + lVar21);
        } while (uVar34 != _c);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_38);
  }
  piVar6 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_98.data != (Allocator *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack4_sse(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 16u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 16u, 4, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;
        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x12
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(r0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(r0 + 4 * 9);
                __m128 _ra = _mm_load_ps(r0 + 4 * 10);
                __m128 _rb = _mm_load_ps(r0 + 4 * 11);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r8);
                _mm_store_ps(tmpptr + 4 * 3, _r1);
                _mm_store_ps(tmpptr + 4 * 4, _r5);
                _mm_store_ps(tmpptr + 4 * 5, _r9);
                _mm_store_ps(tmpptr + 4 * 6, _r2);
                _mm_store_ps(tmpptr + 4 * 7, _r6);
                _mm_store_ps(tmpptr + 4 * 8, _ra);
                _mm_store_ps(tmpptr + 4 * 9, _r3);
                _mm_store_ps(tmpptr + 4 * 10, _r7);
                _mm_store_ps(tmpptr + 4 * 11, _rb);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 48;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x8
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r4);
                _mm_store_ps(tmpptr + 4 * 2, _r1);
                _mm_store_ps(tmpptr + 4 * 3, _r5);
                _mm_store_ps(tmpptr + 4 * 4, _r2);
                _mm_store_ps(tmpptr + 4 * 5, _r6);
                _mm_store_ps(tmpptr + 4 * 6, _r3);
                _mm_store_ps(tmpptr + 4 * 7, _r7);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 32;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x4
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);
                __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                _mm_store_ps(tmpptr, _r0);
                _mm_store_ps(tmpptr + 4, _r1);
                _mm_store_ps(tmpptr + 4 * 2, _r2);
                _mm_store_ps(tmpptr + 4 * 3, _r3);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 16;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                // transpose 4x2
                __m128 _r0 = _mm_load_ps(r0);
                __m128 _r1 = _mm_load_ps(r0 + 4);

                __m128 _r01_0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _r01_1 = _mm_unpackhi_ps(_r0, _r1);

                _mm_store_ps(tmpptr, _r01_0);
                _mm_store_ps(tmpptr + 4, _r01_1);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 8;
            }
        }
        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 4;

            for (int q = 0; q < inch; q++)
            {
                __m128 _val = _mm_load_ps(r0);
                _mm_store_ps(tmpptr, _val);

                r0 += bottom_blob_tm.cstep * 4;
                tmpptr += 4;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 16u, 4, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();
                __m128 _sum8 = _mm_setzero_ps();
                __m128 _sum9 = _mm_setzero_ps();
                __m128 _suma = _mm_setzero_ps();
                __m128 _sumb = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);
                    __m128 _val8 = _mm_load1_ps(r0 + 8);
                    __m128 _val9 = _mm_load1_ps(r0 + 9);
                    __m128 _vala = _mm_load1_ps(r0 + 10);
                    __m128 _valb = _mm_load1_ps(r0 + 11);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);
                    _sum8 = _mm_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm_comp_fmadd_ps(_val9, _w0, _sum9);
                    _suma = _mm_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);
                _mm_store_ps(output0_tm + 4 * 8, _sum8);
                _mm_store_ps(output0_tm + 4 * 9, _sum9);
                _mm_store_ps(output0_tm + 4 * 10, _suma);
                _mm_store_ps(output0_tm + 4 * 11, _sumb);

                output0_tm += 4 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();
                __m128 _sum4 = _mm_setzero_ps();
                __m128 _sum5 = _mm_setzero_ps();
                __m128 _sum6 = _mm_setzero_ps();
                __m128 _sum7 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);
                    __m128 _val4 = _mm_load1_ps(r0 + 4);
                    __m128 _val5 = _mm_load1_ps(r0 + 5);
                    __m128 _val6 = _mm_load1_ps(r0 + 6);
                    __m128 _val7 = _mm_load1_ps(r0 + 7);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                    _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                    _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);
                _mm_store_ps(output0_tm + 4 * 4, _sum4);
                _mm_store_ps(output0_tm + 4 * 5, _sum5);
                _mm_store_ps(output0_tm + 4 * 6, _sum6);
                _mm_store_ps(output0_tm + 4 * 7, _sum7);

                output0_tm += 4 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();
                __m128 _sum2 = _mm_setzero_ps();
                __m128 _sum3 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);
                    __m128 _val2 = _mm_load1_ps(r0 + 2);
                    __m128 _val3 = _mm_load1_ps(r0 + 3);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                    _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);
                _mm_store_ps(output0_tm + 4 * 2, _sum2);
                _mm_store_ps(output0_tm + 4 * 3, _sum3);

                output0_tm += 4 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum0 = _mm_setzero_ps();
                __m128 _sum1 = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);

                    __m128 _val0 = _mm_load1_ps(r0);
                    __m128 _val1 = _mm_load1_ps(r0 + 1);

                    _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum0);
                _mm_store_ps(output0_tm + 4, _sum1);

                output0_tm += 4 * 2;
            }
            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 4; // inch always > 0

                __m128 _sum = _mm_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m128 _w0 = _mm_load_ps(k0);
                    __m128 _val0 = _mm_load1_ps(r0);
                    _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                    r0 += 1;
                    k0 += 4;
                }

                _mm_store_ps(output0_tm, _sum);

                output0_tm += 4;
            }
        }
    }
}